

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O2

int __thiscall
CVmObjClass::get_prop
          (CVmObjClass *this,vm_prop_id_t prop,vm_val_t *val,vm_obj_id_t self,
          vm_obj_id_t *source_obj,uint *argc)

{
  int iVar1;
  vm_meta_entry_t *pvVar2;
  
  pvVar2 = get_meta_entry(this);
  if ((pvVar2 != (vm_meta_entry_t *)0x0) &&
     (iVar1 = (*pvVar2->meta_->_vptr_CVmMetaclass[6])(pvVar2->meta_,val,0,argc,(ulong)prop),
     iVar1 != 0)) {
    *source_obj = self;
    return 1;
  }
  iVar1 = get_prop_from_mod(this,prop,val,self,source_obj,argc);
  if (iVar1 != 0) {
    return 1;
  }
  iVar1 = CVmObject::get_prop(&this->super_CVmObject,prop,val,self,source_obj,argc);
  return iVar1;
}

Assistant:

int CVmObjClass::get_prop(VMG_ vm_prop_id_t prop, vm_val_t *val,
                          vm_obj_id_t self, vm_obj_id_t *source_obj,
                          uint *argc)
{
    /* 
     *   pass the property request as a static property of the metaclass
     *   with which we're associated 
     */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);
    if (entry != 0 && entry->meta_->call_stat_prop(vmg_ val, 0, argc, prop))
    {
        /* the metaclass object handled it, so we are the definer */
        *source_obj = self;
        return TRUE;
    }

    /* 
     *   Try handling it through the modifier object, if we have one.  Note
     *   that we must search our own intrinsic superclass chain, because our
     *   own true intrinsic class is 'intrinsic class,' but we want to expose
     *   the nominal superclass hierarchy of the intrinsic class itself (for
     *   example, we want to search List->Collection->Object, not
     *   List->IntrinsicClass->Object).  
     */
    if (get_prop_from_mod(vmg_ prop, val, self, source_obj, argc))
        return TRUE;

    /* inherit default handling */
    return CVmObject::get_prop(vmg_ prop, val, self, source_obj, argc);
}